

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O2

int blake2s_final(blake2s_state *S,void *out,size_t outlen)

{
  uint32_t *puVar1;
  uint uVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  uint8_t buffer [32];
  
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  iVar4 = -1;
  if (((out != (void *)0x0) && (S->outlen <= outlen)) && (S->f[0] == 0)) {
    sVar3 = S->buflen;
    puVar1 = S->t;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + (uint)sVar3;
    S->t[1] = S->t[1] + (uint)CARRY4(uVar2,(uint)sVar3);
    if (S->last_node != '\0') {
      S->f[1] = 0xffffffff;
    }
    S->f[0] = 0xffffffff;
    memset(S->buf + sVar3,0,0x40 - sVar3);
    blake2s_compress(S,S->buf);
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      *(uint32_t *)(buffer + lVar5 * 4) = S->h[lVar5];
    }
    memcpy(out,buffer,outlen);
    iVar4 = 0;
    memset(buffer,0,0x20);
  }
  return iVar4;
}

Assistant:

int blake2s_final( blake2s_state *S, void *out, size_t outlen )
{
  uint8_t buffer[BLAKE2S_OUTBYTES] = {0};
  size_t i;

  if( out == NULL || outlen < S->outlen )
    return -1;

  if( blake2s_is_lastblock( S ) )
    return -1;

  blake2s_increment_counter( S, ( uint32_t )S->buflen );
  blake2s_set_lastblock( S );
  memset( S->buf + S->buflen, 0, BLAKE2S_BLOCKBYTES - S->buflen ); /* Padding */
  blake2s_compress( S, S->buf );

  for( i = 0; i < 8; ++i ) /* Output full hash to temp buffer */
    store32( buffer + sizeof( S->h[i] ) * i, S->h[i] );

  memcpy( out, buffer, outlen );
  secure_zero_memory(buffer, sizeof(buffer));
  return 0;
}